

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin.cpp
# Opt level: O3

void __thiscall csm::Plugin::Plugin(Plugin *this)

{
  void *pvVar1;
  pthread_mutex_t *__mutex;
  _List_node_base *p_Var2;
  
  this->_vptr_Plugin = (_func_int **)&PTR__Plugin_001247d8;
  if (theList_abi_cxx11_ == (void *)0x0) {
    theList_abi_cxx11_ = operator_new(0x18);
    *(void **)((long)theList_abi_cxx11_ + 8) = theList_abi_cxx11_;
    *(void **)theList_abi_cxx11_ = theList_abi_cxx11_;
    *(undefined8 *)((long)theList_abi_cxx11_ + 0x10) = 0;
  }
  __mutex = (pthread_mutex_t *)impl();
  pthread_mutex_lock(__mutex);
  pvVar1 = theList_abi_cxx11_;
  p_Var2 = (_List_node_base *)operator_new(0x18);
  p_Var2[1]._M_next = (_List_node_base *)this;
  std::__detail::_List_node_base::_M_hook(p_Var2);
  *(long *)((long)pvVar1 + 0x10) = *(long *)((long)pvVar1 + 0x10) + 1;
  pthread_mutex_unlock(__mutex);
  return;
}

Assistant:

Plugin::Plugin()
{
   //---
   // If the list of registered sensor model factories does not exist yet, then
   // create it.
   //---
   if (!theList) theList = new PluginList();

   //---
   // If the list of registered sensor model factories exists now (i.e., no
   // error occurred while creating it), then register the plugin factory in
   // theList by adding a pointer to this list.
   //    The pointer points to the static instance of the derived sensor
   // model plugin.
   //---
   if (theList)
   {
      Impl::Locker locker(impl());

      theList->push_back(this);
   }
}